

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall cs_impl::any::recycle(any *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  proxy *ppVar3;
  
  ppVar3 = this->mDat;
  if (ppVar3 != (proxy *)0x0) {
    psVar1 = &ppVar3->refcount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      if (ppVar3->data != (baseHolder *)0x0) {
        (*ppVar3->data->_vptr_baseHolder[9])();
      }
      if ((DAT_002680d0 < 0x200) && (cs::global_thread_counter == 0)) {
        puVar2 = &allocator + DAT_002680d0;
        DAT_002680d0 = DAT_002680d0 + 1;
        *puVar2 = ppVar3;
      }
      else {
        operator_delete(ppVar3,0x18);
      }
      this->mDat = (proxy *)0x0;
    }
  }
  return;
}

Assistant:

void recycle() noexcept
		{
			if (mDat != nullptr) {
				--mDat->refcount;
				if (mDat->refcount == 0) {
					allocator.free(mDat);
					mDat = nullptr;
				}
			}
		}